

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrRemoveSingletonRows(Llb_Mtr_t *p)

{
  int local_18;
  int local_14;
  int k;
  int i;
  Llb_Mtr_t *p_local;
  
  for (local_14 = 0; local_14 < p->nRows; local_14 = local_14 + 1) {
    if (p->pRowSums[local_14] < 2) {
      p->pRowSums[local_14] = 0;
      for (local_18 = 0; local_18 < p->nCols; local_18 = local_18 + 1) {
        if (p->pMatrix[local_18][local_14] == '\x01') {
          p->pMatrix[local_18][local_14] = '\0';
          p->pColSums[local_18] = p->pColSums[local_18] + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void Llb_MtrRemoveSingletonRows( Llb_Mtr_t * p )
{
    int i, k;
    for ( i = 0; i < p->nRows; i++ )
        if ( p->pRowSums[i] < 2 )
        {
            p->pRowSums[i] = 0;
            for ( k = 0; k < p->nCols; k++ )
            {
                if ( p->pMatrix[k][i] == 1 )
                {
                    p->pMatrix[k][i] = 0;
                    p->pColSums[k]--;
                }
            }
        }
}